

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreState.h
# Opt level: O0

bool __thiscall
axl::sl::BoyerMooreTextState::create
          (BoyerMooreTextState *this,StringRef *pattern,uint64_t charOffset,uint64_t binOffset)

{
  bool bVar1;
  size_t binOffset_00;
  SrcUnit *in_RCX;
  size_t in_RDX;
  BoyerMooreTextState *in_RSI;
  undefined8 in_RDI;
  size_t patternLength;
  SrcUnit *in_stack_ffffffffffffffd8;
  
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::cp
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)in_RSI);
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getEnd
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)in_RSI);
  binOffset_00 = enc::
                 Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::sl::Nop<wchar_t,_wchar_t>,_axl::enc::Utf8Decoder>
                 ::calcRequiredLength
                           (in_RCX,in_stack_ffffffffffffffd8,(utf32_t)((ulong)in_RDI >> 0x20));
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getLength
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)in_RSI);
  bVar1 = create(in_RSI,in_RDX,(uint64_t)in_RCX,binOffset_00);
  return bVar1;
}

Assistant:

bool
	create(
		const sl::StringRef& pattern,
		uint64_t charOffset,
		uint64_t binOffset
	) {
		size_t patternLength = enc::Convert<enc::Utf32, enc::Utf8>::calcRequiredLength(pattern.cp(), pattern.getEnd());
		return create(pattern.getLength(), charOffset, binOffset);
	}